

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O0

Index __thiscall
wasm::ConstHoisting::getWrittenSize<wasm::LEB<int,signed_char>>
          (ConstHoisting *this,LEB<int,_signed_char> *thing)

{
  size_type sVar1;
  undefined1 local_30 [8];
  BufferWithRandomAccess buffer;
  LEB<int,_signed_char> *thing_local;
  ConstHoisting *this_local;
  
  buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)thing;
  BufferWithRandomAccess::BufferWithRandomAccess((BufferWithRandomAccess *)local_30);
  BufferWithRandomAccess::operator<<
            ((BufferWithRandomAccess *)local_30,
             (S32LEB)*(int *)buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  BufferWithRandomAccess::~BufferWithRandomAccess((BufferWithRandomAccess *)local_30);
  return (Index)sVar1;
}

Assistant:

Index getWrittenSize(const T& thing) {
    BufferWithRandomAccess buffer;
    buffer << thing;
    return buffer.size();
  }